

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall soplex::LPColSetBase<double>::reMax(LPColSetBase<double> *this,int newmax)

{
  DataArray<int> *this_00;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  int newsize;
  SVSetBase<double> *in_stack_ffffffffffffffd0;
  
  SVSetBase<double>::reMax
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  newsize = (int)((ulong)(in_RDI + 0x80) >> 0x20);
  max((LPColSetBase<double> *)0x2378c7);
  VectorBase<double>::reSize((VectorBase<double> *)in_stack_ffffffffffffffd0,newsize);
  this_00 = (DataArray<int> *)(in_RDI + 0x68);
  max((LPColSetBase<double> *)0x2378e8);
  VectorBase<double>::reSize((VectorBase<double> *)this_00,newsize);
  max((LPColSetBase<double> *)0x23790c);
  VectorBase<double>::reSize((VectorBase<double> *)this_00,newsize);
  max((LPColSetBase<double> *)0x237930);
  DataArray<int>::reSize(this_00,newsize);
  return;
}

Assistant:

void reMax(int newmax = 0)
   {
      SVSetBase<R>::reMax(newmax);
      up.reSize(max());
      low.reSize(max());
      object.reSize(max());
      scaleExp.reSize(max());
   }